

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

void DDecalSlider::InPlaceConstructor(void *mem)

{
  DThinker::DThinker((DThinker *)mem,0x24);
  *(undefined ***)mem = &PTR_StaticType_006f2c88;
  return;
}

Assistant:

void DDecalSlider::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("starttime", TimeToStart)
		("endtime", TimeToStop)
		("disty", DistY)
		("starty", StartY)
		("started", bStarted);
}